

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O1

bool __thiscall
cmStandardLevelResolver::GetNewRequiredStandard
          (cmStandardLevelResolver *this,string *targetName,string *feature,
          cmValue currentLangStandardValue,string *newRequiredStandard,string *error)

{
  cmMakefile *makefile;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  key_type *__key;
  __node_ptr p_Var4;
  StandardNeeded SVar5;
  cmValue cVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string lang;
  string local_e8;
  string local_c8;
  string *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  bVar2 = CheckCompileFeaturesAvailable(this,targetName,feature,&local_c8,error);
  if (bVar2) {
    local_a8 = targetName;
    __key = (key_type *)
            std::_Hash_bytes(local_c8._M_dataplus._M_p,local_c8._M_string_length,0xc70f6907);
    bVar2 = false;
    p_Var4 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)((ulong)__key % DAT_00975940),(size_type)&local_c8,__key,
                            (__hash_code)__key);
    if (p_Var4 == (__node_ptr)0x0) goto LAB_002d09b7;
    makefile = this->Makefile;
    if (currentLangStandardValue.Value == (string *)0x0) {
      newRequiredStandard->_M_string_length = 0;
      *(newRequiredStandard->_M_dataplus)._M_p = '\0';
    }
    else {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
    }
    SVar5 = anon_unknown.dwarf_c254fe::StandardLevelComputer::HighestStandardNeeded
                      ((StandardLevelComputer *)
                       ((long)&(p_Var4->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                               ._M_storage._M_storage + 0x20),makefile,feature);
    if (currentLangStandardValue.Value == (string *)0x0) {
      local_88 = *(undefined8 *)
                  ((long)&(p_Var4->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                          ._M_storage._M_storage + 0x20);
      local_90 = *(undefined8 *)
                  ((long)&(p_Var4->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                          ._M_storage._M_storage + 0x28);
      local_a0._M_len = 6;
      local_a0._M_str = "CMAKE_";
      local_80 = 0x11;
      local_78 = "_STANDARD_DEFAULT";
      views._M_len = 3;
      views._M_array = &local_a0;
      cmCatViews_abi_cxx11_(&local_e8,views);
      cVar6 = cmMakefile::GetDefinition(makefile,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
        currentLangStandardValue = cVar6;
      }
    }
    _Var7._M_current =
         *(int **)((long)&(p_Var4->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                          ._M_storage._M_storage + 0x48);
    if (currentLangStandardValue.Value != (string *)0x0) {
      uVar1 = *(undefined8 *)
               ((long)&(p_Var4->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                       ._M_storage._M_storage + 0x40);
      iVar3 = anon_unknown.dwarf_c254fe::ParseStd(currentLangStandardValue.Value);
      local_a0._M_len = CONCAT44(local_a0._M_len._4_4_,iVar3);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (uVar1,_Var7._M_current);
      if (_Var7._M_current ==
          *(int **)((long)&(p_Var4->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                           ._M_storage._M_storage + 0x48)) {
        local_88 = *(undefined8 *)
                    ((long)&(p_Var4->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                            ._M_storage._M_storage + 0x20);
        local_90 = *(undefined8 *)
                    ((long)&(p_Var4->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                            ._M_storage._M_storage + 0x28);
        local_a0._M_len = 4;
        local_a0._M_str = "The ";
        local_80 = 0x1e;
        local_78 = "_STANDARD property on target \"";
        local_68 = (local_a8->_M_dataplus)._M_p;
        local_70 = local_a8->_M_string_length;
        local_60 = 0x1f;
        local_58 = "\" contained an invalid value: \"";
        local_48 = ((currentLangStandardValue.Value)->_M_dataplus)._M_p;
        local_50 = (currentLangStandardValue.Value)->_M_string_length;
        local_40 = 2;
        local_38 = "\".";
        views_00._M_len = 7;
        views_00._M_array = &local_a0;
        cmCatViews_abi_cxx11_(&local_e8,views_00);
        if (error == (string *)0x0) {
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_e8);
        }
        else {
          std::__cxx11::string::_M_assign((string *)error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002d09b4;
      }
    }
    bVar2 = true;
    if ((SVar5.index != -1) &&
       ((_Var7._M_current ==
         *(int **)((long)&(p_Var4->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                          ._M_storage._M_storage + 0x48) ||
        (_Var7._M_current <
         (int *)((long)SVar5.index * 4 +
                *(long *)((long)&(p_Var4->
                                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>
                                 ._M_storage._M_storage + 0x40)))))) {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
    }
  }
  else {
LAB_002d09b4:
    bVar2 = false;
  }
LAB_002d09b7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmStandardLevelResolver::GetNewRequiredStandard(
  const std::string& targetName, const std::string& feature,
  cmValue currentLangStandardValue, std::string& newRequiredStandard,
  std::string* error) const
{
  std::string lang;
  if (!this->CheckCompileFeaturesAvailable(targetName, feature, lang, error)) {
    return false;
  }

  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.GetNewRequiredStandard(
      this->Makefile, targetName, feature, currentLangStandardValue,
      newRequiredStandard, error);
  }
  return false;
}